

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MazeHeap.h
# Opt level: O2

void __thiscall CMazeHeap::Push(CMazeHeap *this,CGrid *pGrid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint iPos2;
  uint iPos2_00;
  ulong uVar5;
  
  iVar1 = this->m_iSize;
  uVar4 = (ulong)iVar1;
  if (0x27fff < (long)uVar4) {
    __assert_fail("m_iSize<MAX_QUEUE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                  ,0xb4,"void CMazeHeap::Push(CGrid *)");
  }
  iVar3 = pGrid->m_iHeapPos;
  uVar5 = (ulong)iVar3;
  if ((long)uVar5 < 0) {
    pGrid->m_iHeapPos = iVar1;
    this->m_iSize = iVar1 + 1;
    m_Queue[uVar4] = pGrid;
    if (iVar1 == 0) {
      return;
    }
    iVar1 = pGrid->m_iMazePCost;
    while( true ) {
      uVar5 = (long)((int)uVar4 + -1) / 2;
      iVar3 = (int)uVar5;
      if (m_Queue[iVar3]->m_iMazePCost <= iVar1) break;
      Swab(this,(int)uVar4,iVar3);
      uVar4 = uVar5 & 0xffffffff;
    }
  }
  else {
    if (m_Queue[uVar5] != pGrid) {
      __assert_fail("pGrid==m_Queue[pGrid->m_iHeapPos]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                    ,0xcb,"void CMazeHeap::Push(CGrid *)");
    }
    iVar2 = pGrid->m_iMazePCost;
    if ((iVar3 == 0) || (m_Queue[iVar3 - 1U >> 1]->m_iMazePCost <= iVar2)) {
      if (iVar1 == 0) {
        return;
      }
      while( true ) {
        iVar1 = (int)uVar5;
        iPos2_00 = iVar1 * 2 + 1;
        iVar3 = (int)uVar4;
        if ((iVar3 <= (int)iPos2_00) || (iPos2 = iVar1 * 2 + 2, iVar3 <= (int)iPos2)) break;
        iVar3 = m_Queue[iPos2]->m_iMazePCost;
        if (m_Queue[iPos2_00]->m_iMazePCost < iVar3) {
          iPos2 = iPos2_00;
          iVar3 = m_Queue[iPos2_00]->m_iMazePCost;
        }
        if (iVar2 <= iVar3) goto LAB_00110cb0;
        Swab(this,iVar1,iPos2);
        uVar4 = (ulong)(uint)this->m_iSize;
        uVar5 = (ulong)iPos2;
      }
      if (((int)iPos2_00 < iVar3) && (m_Queue[iPos2_00]->m_iMazePCost < iVar2)) {
        Swab(this,iVar1,iPos2_00);
      }
    }
    else {
      while( true ) {
        uVar4 = (long)((int)uVar5 + -1) / 2;
        if (m_Queue[uVar4 & 0xffffffff]->m_iMazePCost <= iVar2) break;
        Swab(this,(int)uVar5,(int)uVar4);
        uVar5 = uVar4 & 0xffffffff;
      }
    }
  }
LAB_00110cb0:
  if (m_Queue[pGrid->m_iHeapPos] == pGrid) {
    return;
  }
  __assert_fail("pGrid==m_Queue[pGrid->m_iHeapPos]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                ,0x106,"void CMazeHeap::Push(CGrid *)");
}

Assistant:

void Push(CGrid* pGrid)
	{
		assert(m_iSize<MAX_QUEUE);
		if(pGrid->m_iHeapPos<0)
		{
			int	iCurPos			=	m_iSize;
			pGrid->m_iHeapPos	=	iCurPos;

			m_Queue[m_iSize++]	=	pGrid;

			int	iCurCost	=	pGrid->GetHeapCost();

			if(iCurPos==0)	return;

			while(TRUE)
			{
				int	iParPos		=	(iCurPos-1)/2;

				if(iCurCost>=m_Queue[iParPos]->GetHeapCost())	break;			
				Swab(iCurPos,iParPos);
				iCurPos	=	iParPos;
			}
		}
		else
		{
			assert(pGrid==m_Queue[pGrid->m_iHeapPos]);
			int	iCurPos		=	pGrid->m_iHeapPos;
			int	iParPos		=	(iCurPos-1)/2;

			int	iCurCost	=	pGrid->GetHeapCost();

			if(iCurPos&&iCurCost<m_Queue[iParPos]->GetHeapCost())
			{
				while(TRUE)
				{
					int	iParPos		=	(iCurPos-1)/2;

					if(iCurCost>=m_Queue[iParPos]->GetHeapCost())	break;
					Swab(iCurPos,iParPos);
					iCurPos	=	iParPos;
				}
			}
			else
			{
				if(m_iSize==0)	return;

				while (TRUE)
				{
					int	iLChildPos	=	iCurPos+iCurPos+1;
					int	iRChildPos	=	iLChildPos+1;

					// both are valid children [2/19/2007 thyeros]
					if(iLChildPos<m_iSize&&iRChildPos<m_iSize)
					{
						int	iLChildCost	=	m_Queue[iLChildPos]->GetHeapCost();
						int	iRChildCost	=	m_Queue[iRChildPos]->GetHeapCost();

						if(iLChildCost<iRChildCost)
						{
							if(iCurCost<=iLChildCost)	break;
							Swab(iCurPos,iLChildPos);
							iCurPos	=	iLChildPos;
						}
						else
						{
							if(iCurCost<=iRChildCost)	break;
							Swab(iCurPos,iRChildPos);
							iCurPos	=	iRChildPos;
						}
					}
					else if(iLChildPos<m_iSize)
					{
						if(iCurCost<=m_Queue[iLChildPos]->GetHeapCost())	break;
						Swab(iCurPos,iLChildPos);
						break;
					}
					else 
					{
						break;
					}
				}
			}
		}

		assert(pGrid==m_Queue[pGrid->m_iHeapPos]);
	}